

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O0

void GraphTask::run_bfs(task_data *D,multi_ex *ec)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference puVar4;
  reference ppeVar5;
  size_t sVar6;
  wclass *pwVar7;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  long in_RDI;
  reference rVar8;
  reference rVar9;
  reference rVar10;
  uint32_t n_2;
  uint32_t m;
  size_t j;
  size_t id;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  uint32_t n_1;
  size_t i;
  size_t n;
  vector<bool,_std::allocator<bool>_> touched;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe90;
  _Bit_type *in_stack_fffffffffffffe98;
  _Bit_type in_stack_fffffffffffffea0;
  _Bit_type *in_stack_fffffffffffffea8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffeb0;
  byte local_129;
  undefined8 in_stack_fffffffffffffee8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffef0;
  ulong uVar11;
  reference local_f8;
  reference local_e8;
  uint local_d4;
  reference local_d0;
  int local_bc;
  reference local_b8;
  uint32_t local_a4;
  ulong local_a0;
  size_type local_98;
  unsigned_long *local_90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  reference local_80;
  uint local_74;
  ulong local_70;
  undefined4 local_64;
  reference local_60 [2];
  ulong local_40;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x165bc8);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x165bd5);
  for (local_40 = 0; local_40 < *(uint *)(local_8 + 0x40); local_40 = local_40 + 1) {
    std::vector<bool,_std::allocator<bool>_>::push_back
              (in_stack_fffffffffffffef0,SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0));
  }
  local_60[0] = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  std::_Bit_reference::operator=(local_60,true);
  local_64 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (in_stack_fffffffffffffe90,(value_type_conflict *)in_stack_fffffffffffffe88);
  rVar9._M_mask = in_stack_fffffffffffffea0;
  rVar9._M_p = in_stack_fffffffffffffea8;
  rVar10._M_mask = (_Bit_type)in_stack_fffffffffffffe90;
  rVar10._M_p = in_stack_fffffffffffffe98;
  local_70 = 0;
  do {
    do {
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_8 + 0x60));
      if (*(uint *)(local_8 + 0x40) <= sVar2) {
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x1660b4);
        return;
      }
      while( true ) {
        uVar11 = local_70;
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_8 + 0x60));
        if (sVar2 <= uVar11) break;
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_8 + 0x60),
                            local_70);
        local_74 = *pvVar3;
        local_80 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 *)(local_8 + 0x48),(ulong)local_74);
        local_88._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       (in_stack_fffffffffffffe88);
        local_90 = (unsigned_long *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                             (in_stack_fffffffffffffe88);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)rVar10._M_mask,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)in_stack_fffffffffffffe88);
          if (!bVar1) break;
          puVar4 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_88);
          local_98 = *puVar4;
          local_a0 = 0;
          while( true ) {
            uVar11 = local_a0;
            ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                (local_10,local_98);
            sVar6 = v_array<COST_SENSITIVE::wclass>::size
                              ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar5)->l).simple);
            if (sVar6 <= uVar11) break;
            ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                                (local_10,local_98);
            pwVar7 = v_array<COST_SENSITIVE::wclass>::operator[]
                               ((v_array<COST_SENSITIVE::wclass> *)&((*ppeVar5)->l).simple,local_a0)
            ;
            local_a4 = pwVar7->class_index;
            local_129 = 0;
            if (local_a4 != 0) {
              rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (in_stack_fffffffffffffeb0,(size_type)rVar9._M_p);
              local_b8 = rVar8;
              bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_b8);
              local_129 = bVar1 ^ 0xff;
            }
            if ((local_129 & 1) != 0) {
              local_bc = local_a4 - 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)rVar10._M_mask,
                         (value_type_conflict *)in_stack_fffffffffffffe88);
              rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (in_stack_fffffffffffffeb0,(size_type)rVar9._M_p);
              in_stack_fffffffffffffeb0 = (vector<bool,_std::allocator<bool>_> *)rVar8._M_mask;
              local_d0 = rVar8;
              std::_Bit_reference::operator=(&local_d0,true);
            }
            local_a0 = local_a0 + 1;
          }
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&local_88);
        }
        local_70 = local_70 + 1;
      }
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_8 + 0x60));
    } while (*(uint *)(local_8 + 0x40) <= sVar2);
    for (local_d4 = 0; local_d4 < *(uint *)(local_8 + 0x40); local_d4 = local_d4 + 1) {
      rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffeb0,(size_type)rVar9._M_p);
      local_e8 = rVar9;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_e8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffeb0,(size_type)rVar9._M_p);
        local_f8 = rVar10;
        std::_Bit_reference::operator=(&local_f8,true);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)rVar9._M_mask,
                   (value_type_conflict *)rVar10._M_p);
        break;
      }
    }
  } while( true );
}

Assistant:

void run_bfs(task_data& D, multi_ex& ec)
{
  D.bfs.clear();
  vector<bool> touched;
  for (size_t n = 0; n < D.N; n++) touched.push_back(false);

  touched[0] = true;
  D.bfs.push_back(0);

  size_t i = 0;
  while (D.bfs.size() < D.N)
  {
    while (i < D.bfs.size())
    {
      uint32_t n = D.bfs[i];
      for (size_t id : D.adj[n])
        for (size_t j = 0; j < ec[id]->l.cs.costs.size(); j++)
        {
          uint32_t m = ec[id]->l.cs.costs[j].class_index;
          if ((m > 0) && (!touched[m - 1]))
          {
            D.bfs.push_back(m - 1);
            touched[m - 1] = true;
          }
        }
      i++;
    }

    if (D.bfs.size() < D.N)
      // we finished a SCC, need to find another
      for (uint32_t n = 0; n < D.N; n++)
        if (!touched[n])
        {
          touched[n] = true;
          D.bfs.push_back(n);
          break;
        }
  }
}